

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_engine_base.cpp
# Opt level: O0

void __thiscall
zmq::stream_engine_base_t::stream_engine_base_t
          (stream_engine_base_t *this,fd_t fd_,options_t *options_,
          endpoint_uri_pair_t *endpoint_uri_pair_,bool has_handshake_stage_)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  uint in_ESI;
  EVP_PKEY_CTX *ctx;
  endpoint_uri_pair_t *in_RDI;
  byte in_R8B;
  char *errstr;
  int rc;
  fd_t in_stack_0000018c;
  undefined8 in_stack_ffffffffffffff90;
  undefined8 *puVar4;
  fd_t s_;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  io_object_t *in_stack_ffffffffffffffa0;
  
  s_ = (fd_t)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  io_object_t::io_object_t
            (in_stack_ffffffffffffffa0,
             (io_thread_t *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  i_engine::i_engine((i_engine *)&(in_RDI->local).field_2._M_allocated_capacity);
  *(undefined ***)&in_RDI->local = &PTR__stream_engine_base_t_002cb670;
  (in_RDI->local).field_2._M_allocated_capacity = (size_type)&DAT_002cb730;
  options_t::options_t(_rc,(options_t *)errstr);
  *(undefined8 *)&in_RDI[0x12].local = 0;
  in_RDI[0x12].local._M_string_length = 0;
  in_RDI[0x12].local.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&in_RDI[0x12].local.field_2 + 8) = 0;
  *(undefined8 *)&in_RDI[0x12].remote = 0;
  in_RDI[0x12].remote._M_string_length = 0;
  in_RDI[0x12].remote.field_2._M_allocated_capacity = 0;
  *(undefined8 *)&in_RDI[0x12].local_type = 0;
  *(undefined8 *)((long)&in_RDI[0x12].remote.field_2 + 8) = 0;
  in_RDI[0x13].local._M_string_length = 0;
  *(undefined8 *)&in_RDI[0x13].local = 0;
  in_RDI[0x13].local.field_2._M_allocated_capacity = 0;
  in_RDI[0x13].local.field_2._M_local_buf[8] = '\0';
  in_RDI[0x13].local.field_2._M_local_buf[9] = '\0';
  endpoint_uri_pair_t::endpoint_uri_pair_t(in_RDI,(endpoint_uri_pair_t *)&in_RDI[0x13].remote);
  in_RDI[0x14].remote._M_dataplus = (_Alloc_hider)0x0;
  in_RDI[0x14].remote.field_0x1 = 0;
  in_RDI[0x14].remote.field_0x2 = 0;
  in_RDI[0x14].remote.field_0x3 = 0;
  ctx = (EVP_PKEY_CTX *)(ulong)in_ESI;
  get_peer_address_abi_cxx11_(in_stack_0000018c);
  *(uint *)&in_RDI[0x15].local = in_ESI;
  in_RDI[0x15].local._M_string_length = 0;
  in_RDI[0x15].local.field_2._M_local_buf[0] = '\0';
  in_RDI[0x15].local.field_2._M_local_buf[1] = '\x01';
  in_RDI[0x16].local.field_2._M_local_buf[0] = '\0';
  *(undefined8 *)((long)&in_RDI[0x16].local.field_2 + 8) = 0;
  *(undefined8 *)&in_RDI[0x16].remote = 0;
  *(byte *)&in_RDI[0x16].remote._M_string_length = in_R8B & 1;
  iVar1 = msg_t::init((msg_t *)((long)&in_RDI[0x15].local.field_2 + 8),ctx);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    puVar4 = (undefined8 *)&stderr;
    fprintf(_stderr,"%s (%s:%d)\n",pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_engine_base.cpp"
            ,0x88);
    fflush((FILE *)*puVar4);
    s_ = (fd_t)((ulong)puVar4 >> 0x20);
    zmq_abort((char *)0x238928);
  }
  unblock_socket(s_);
  return;
}

Assistant:

zmq::stream_engine_base_t::stream_engine_base_t (
  fd_t fd_,
  const options_t &options_,
  const endpoint_uri_pair_t &endpoint_uri_pair_,
  bool has_handshake_stage_) :
    _options (options_),
    _inpos (NULL),
    _insize (0),
    _decoder (NULL),
    _outpos (NULL),
    _outsize (0),
    _encoder (NULL),
    _mechanism (NULL),
    _next_msg (NULL),
    _process_msg (NULL),
    _metadata (NULL),
    _input_stopped (false),
    _output_stopped (false),
    _endpoint_uri_pair (endpoint_uri_pair_),
    _has_handshake_timer (false),
    _has_ttl_timer (false),
    _has_timeout_timer (false),
    _has_heartbeat_timer (false),
    _peer_address (get_peer_address (fd_)),
    _s (fd_),
    _handle (static_cast<handle_t> (NULL)),
    _plugged (false),
    _handshaking (true),
    _io_error (false),
    _session (NULL),
    _socket (NULL),
    _has_handshake_stage (has_handshake_stage_)
{
    const int rc = _tx_msg.init ();
    errno_assert (rc == 0);

    //  Put the socket into non-blocking mode.
    unblock_socket (_s);
}